

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

void Setup_DataArrays(ParseData *lParse,int nCols,iteratorCol *cols,long fRow,long nRows)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  undefined8 in_RCX;
  size_t sVar6;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  size_t in_R8;
  bool bVar7;
  DataInfo *varData;
  iteratorCol *icol;
  int do_realloc;
  char msg [80];
  double *rarray;
  long *iarray;
  char *barray;
  char **sptr;
  char **bitStrs;
  long idx;
  long row;
  long len;
  long nelem;
  int i;
  bool local_103;
  bool local_102;
  bool local_101;
  int local_100;
  int local_fc;
  bool local_f5;
  char local_c8 [80];
  double *local_78;
  long *local_70;
  char *local_68;
  undefined8 *local_60;
  long *local_58;
  long local_50;
  size_t local_48;
  size_t local_40;
  long local_38;
  int local_2c;
  size_t local_28;
  long local_18;
  int local_c;
  long local_8;
  
  *(undefined8 *)(in_RDI + 0xb8) = in_RCX;
  *(size_t *)(in_RDI + 0xc0) = in_R8;
  bVar7 = *(size_t *)(in_RDI + 0xd0) != in_R8;
  local_2c = 0;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  do {
    if (local_c <= local_2c) {
      *(size_t *)(local_8 + 0xd0) = local_28;
      return;
    }
    lVar2 = local_18 + (long)local_2c * 0x110;
    lVar3 = *(long *)(local_8 + 0xa8) + (long)local_2c * 0xa0;
    if ((*(int *)(lVar2 + 0x58) != 2) && (*(int *)(lVar2 + 0x58) != 3)) {
      local_38 = *(long *)(lVar3 + 0x58);
      local_40 = local_38 * local_28;
      switch(*(undefined4 *)(lVar3 + 0x54)) {
      case 0x102:
        local_68 = *(char **)(lVar2 + 0x60);
        if (bVar7) {
          if (*(long *)(lVar3 + 0x90) != 0) {
            free(*(void **)(lVar3 + 0x90));
          }
          pvVar4 = malloc(local_40);
          *(void **)(lVar3 + 0x90) = pvVar4;
          if (*(long *)(lVar3 + 0x90) == 0) {
            *(undefined4 *)(local_8 + 0xe0) = 0x71;
            break;
          }
        }
        while (sVar6 = local_40 - 1, local_40 != 0) {
          local_101 = false;
          if (*local_68 != '\0') {
            local_101 = *local_68 == local_68[local_40];
          }
          *(bool *)(*(long *)(lVar3 + 0x90) + sVar6) = local_101;
          local_40 = sVar6;
        }
        *(char **)(lVar3 + 0x98) = local_68 + 1;
        local_40 = sVar6;
        break;
      case 0x103:
        local_70 = *(long **)(lVar2 + 0x60);
        if (bVar7) {
          if (*(long *)(lVar3 + 0x90) != 0) {
            free(*(void **)(lVar3 + 0x90));
          }
          pvVar4 = malloc(local_40);
          *(void **)(lVar3 + 0x90) = pvVar4;
          if (*(long *)(lVar3 + 0x90) == 0) {
            *(undefined4 *)(local_8 + 0xe0) = 0x71;
            break;
          }
        }
        while (sVar6 = local_40 - 1, local_40 != 0) {
          local_102 = false;
          if (*local_70 != 0) {
            local_102 = *local_70 == local_70[local_40];
          }
          *(bool *)(*(long *)(lVar3 + 0x90) + sVar6) = local_102;
          local_40 = sVar6;
        }
        *(long **)(lVar3 + 0x98) = local_70 + 1;
        local_40 = sVar6;
        break;
      case 0x104:
        local_78 = *(double **)(lVar2 + 0x60);
        if (bVar7) {
          if (*(long *)(lVar3 + 0x90) != 0) {
            free(*(void **)(lVar3 + 0x90));
          }
          pvVar4 = malloc(local_40);
          *(void **)(lVar3 + 0x90) = pvVar4;
          if (*(long *)(lVar3 + 0x90) == 0) {
            *(undefined4 *)(local_8 + 0xe0) = 0x71;
            break;
          }
        }
        while (sVar6 = local_40 - 1, local_40 != 0) {
          local_103 = false;
          if ((*local_78 != 0.0) || (NAN(*local_78))) {
            local_103 = *local_78 == local_78[local_40];
          }
          *(bool *)(*(long *)(lVar3 + 0x90) + sVar6) = local_103;
          local_40 = sVar6;
        }
        *(double **)(lVar3 + 0x98) = local_78 + 1;
        local_40 = sVar6;
        break;
      case 0x105:
        local_60 = *(undefined8 **)(lVar2 + 0x60);
        if (bVar7) {
          if (*(long *)(lVar3 + 0x90) != 0) {
            free(*(void **)(lVar3 + 0x90));
          }
          pvVar4 = malloc(local_28);
          *(void **)(lVar3 + 0x90) = pvVar4;
          if (*(long *)(lVar3 + 0x90) == 0) {
            *(undefined4 *)(local_8 + 0xe0) = 0x71;
            break;
          }
        }
        local_48 = local_28;
        while (sVar6 = local_48 - 1, local_48 != 0) {
          local_f5 = false;
          if (*(char *)*local_60 != '\0') {
            if (*(char *)*local_60 < *(char *)local_60[local_48]) {
              local_fc = -1;
              local_48 = sVar6;
            }
            else {
              if (*(char *)local_60[local_48] < *(char *)*local_60) {
                local_100 = 1;
                local_48 = sVar6;
              }
              else {
                puVar1 = local_60 + local_48;
                local_48 = sVar6;
                local_100 = strcmp((char *)*local_60,(char *)*puVar1);
              }
              local_fc = local_100;
            }
            local_f5 = local_fc == 0;
            sVar6 = local_48;
          }
          local_48 = sVar6;
          *(bool *)(*(long *)(lVar3 + 0x90) + local_48) = local_f5;
        }
        *(undefined8 **)(lVar3 + 0x98) = local_60 + 1;
        local_48 = sVar6;
        break;
      case 0x106:
        local_40 = (local_38 + 1) * local_28;
        local_58 = *(long **)(lVar3 + 0x98);
        if (bVar7) {
          if (local_58 != (long *)0x0) {
            if (*local_58 == 0) {
              printf("invalid free(bitStrs[0]) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x599);
            }
            else {
              free((void *)*local_58);
            }
          }
          free(local_58);
          local_58 = (long *)malloc(local_28 << 3);
          if (local_58 == (long *)0x0) {
            *(undefined8 *)(lVar3 + 0x90) = 0;
            *(undefined8 *)(lVar3 + 0x98) = 0;
            *(undefined4 *)(local_8 + 0xe0) = 0x71;
          }
          else {
            pvVar4 = malloc(local_40);
            *local_58 = (long)pvVar4;
            if (*local_58 != 0) goto LAB_0013ef81;
            free(local_58);
            *(undefined8 *)(lVar3 + 0x90) = 0;
            *(undefined8 *)(lVar3 + 0x98) = 0;
            *(undefined4 *)(local_8 + 0xe0) = 0x71;
          }
        }
        else {
LAB_0013ef81:
          for (local_48 = 0; (long)local_48 < (long)local_28; local_48 = local_48 + 1) {
            local_58[local_48] = *local_58 + local_48 * (local_38 + 1);
            local_50 = local_48 * ((local_38 + 7) / 8) + 1;
            for (local_40 = 0; (long)local_40 < local_38; local_40 = local_40 + 1) {
              if (((int)*(char *)(*(long *)(lVar2 + 0x60) + local_50) &
                  1 << (7U - (char)((long)local_40 % 8) & 0x1f)) == 0) {
                *(undefined1 *)(local_58[local_48] + local_40) = 0x30;
              }
              else {
                *(undefined1 *)(local_58[local_48] + local_40) = 0x31;
              }
              if ((long)local_40 % 8 == 7) {
                local_50 = local_50 + 1;
              }
            }
            *(undefined1 *)(local_58[local_48] + local_40) = 0;
          }
          *(long **)(lVar3 + 0x90) = local_58;
          *(long **)(lVar3 + 0x98) = local_58;
        }
        break;
      default:
        snprintf(local_c8,0x50,"SetupDataArrays, unhandled type %d\n",(ulong)*(uint *)(lVar3 + 0x54)
                );
        ffpmsg((char *)0x13f6bc);
      }
      if (*(int *)(local_8 + 0xe0) != 0) {
        while (iVar5 = local_2c + -1, local_2c != 0) {
          lVar2 = *(long *)(local_8 + 0xa8) + (long)iVar5 * 0xa0;
          local_2c = iVar5;
          if (*(int *)(lVar2 + 0x54) == 0x106) {
            if (**(long **)(lVar2 + 0x98) == 0) {
              printf("invalid free(((char**)varData->data)[0]) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x60c);
            }
            else {
              free((void *)**(undefined8 **)(lVar2 + 0x98));
            }
          }
          if (*(long *)(lVar2 + 0x90) == 0) {
            printf("invalid free(varData->undef) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,0x60d);
          }
          else {
            free(*(void **)(lVar2 + 0x90));
          }
          *(undefined8 *)(lVar2 + 0x90) = 0;
        }
        *(undefined8 *)(local_8 + 0xd0) = 0;
        return;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static void Setup_DataArrays( ParseData *lParse, int nCols, iteratorCol *cols,
                              long fRow, long nRows )
    /***********************************************************************/
    /*  Setup the varData array in gParse to contain the fits column data. */
    /*  Then, allocate and initialize the necessary UNDEF arrays for each  */
    /*  column used by the parser.                                         */
    /***********************************************************************/
{
   int     i;
   long    nelem, len, row, idx;
   char  **bitStrs;
   char  **sptr;
   char   *barray;
   long   *iarray;
   double *rarray;
   char msg[80];
   int do_realloc = 0;

   lParse->firstDataRow = fRow;
   lParse->nDataRows    = nRows;
   /* Only perform reallocations if the number of rows changed */
   if (lParse->nPrevDataRows != nRows) do_realloc = 1;

   /*  Resize and fill in UNDEF arrays for each column  */

   for( i=0; i<nCols; i++ ) {

      iteratorCol *icol = cols + i;
      DataInfo *varData = lParse->varData + i;

      if( icol->iotype == OutputCol || icol->iotype == TemporaryCol ) continue;

      nelem  = varData->nelem;
      len    = nelem * nRows;

      switch ( varData->type ) {

      case BITSTR:
      /* No need for UNDEF array, but must make string DATA array */
         len = (nelem+1)*nRows;   /* Count '\0' */
         bitStrs = (char**)varData->data;
	 if (do_realloc) {
	   if( bitStrs ) FREE( bitStrs[0] );
	   free( bitStrs );
	   bitStrs = (char**)malloc( nRows*sizeof(char*) );
	   if( bitStrs==NULL ) {
	     varData->data = varData->undef = NULL;
	     lParse->status = MEMORY_ALLOCATION;
	     break;
	   }
	   bitStrs[0] = (char*)malloc( len*sizeof(char) );
	   if( bitStrs[0]==NULL ) {
	     free( bitStrs );
	     varData->data = varData->undef = NULL;
	     lParse->status = MEMORY_ALLOCATION;
	     break;
	   }
	 }

         for( row=0; row<nRows; row++ ) {
            bitStrs[row] = bitStrs[0] + row*(nelem+1);
            idx = (row)*( (nelem+7)/8 ) + 1;
            for(len=0; len<nelem; len++) {
               if( ((char*)icol->array)[idx] & (1<<(7-len%8)) )
                  bitStrs[row][len] = '1';
               else
                  bitStrs[row][len] = '0';
               if( len%8==7 ) idx++;
            }
            bitStrs[row][len] = '\0';
         }
         varData->undef = (char*)bitStrs;
         varData->data  = (char*)bitStrs;
         break;

      case STRING:
         sptr = (char**)icol->array;
	 if (do_realloc) {
	   if (varData->undef)
	     free( varData->undef );
	   varData->undef = (char*)malloc( nRows*sizeof(char) );
	   if( varData->undef==NULL ) {
	     lParse->status = MEMORY_ALLOCATION;
	     break;
	   }
	 }
         row = nRows;
         while( row-- )
            varData->undef[row] =
               ( **sptr != '\0' && FSTRCMP( sptr[0], sptr[row+1] )==0 );
         varData->data  = sptr + 1;
         break;

      case BOOLEAN:
         barray = (char*)icol->array;
	 if (do_realloc) {
	   if (varData->undef)
	     free( varData->undef );
	   varData->undef = (char*)malloc( len*sizeof(char) );
	   if( varData->undef==NULL ) {
	     lParse->status = MEMORY_ALLOCATION;
	     break;
	   }
	 }
         while( len-- ) {
            varData->undef[len] = 
               ( barray[0]!=0 && barray[0]==barray[len+1] );
         }
         varData->data  = barray + 1;
         break;

      case LONG:
         iarray = (long*)icol->array;
	 if (do_realloc) {
	   if (varData->undef)
	     free( varData->undef );
	   varData->undef = (char*)malloc( len*sizeof(char) );
	   if( varData->undef==NULL ) {
	     lParse->status = MEMORY_ALLOCATION;
	     break;
	   }
	 }
         while( len-- ) {
            varData->undef[len] = 
               ( iarray[0]!=0L && iarray[0]==iarray[len+1] );
         }
         varData->data  = iarray + 1;
         break;

      case DOUBLE:
         rarray = (double*)icol->array;
	 if (do_realloc) {
	   if (varData->undef)
	     free( varData->undef );
	   varData->undef = (char*)malloc( len*sizeof(char) );
	   if( varData->undef==NULL ) {
	     lParse->status = MEMORY_ALLOCATION;
	     break;
	   }
	 }
         while( len-- ) {
            varData->undef[len] = 
               ( rarray[0]!=0.0 && rarray[0]==rarray[len+1]);
         }
         varData->data  = rarray + 1;
         break;

      default:
         snprintf(msg, 80, "SetupDataArrays, unhandled type %d\n",
                varData->type);
         ffpmsg(msg);
      }

      if( lParse->status ) {  /*  Deallocate NULL arrays of previous columns */
         while( i-- ) {
            varData = lParse->varData + i;
            if( varData->type==BITSTR )
               FREE( ((char**)varData->data)[0] );
            FREE( varData->undef );
            varData->undef = NULL;
         }
	 lParse->nPrevDataRows = 0;
         return;
      }
   }

   lParse->nPrevDataRows = nRows;
}